

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpRepeatedMessageOrGroup<false,true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  long v1;
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint32_t uVar4;
  undefined1 auVar5 [16];
  int iVar6;
  RepeatedPtrFieldBase *field;
  MessageLite *msg_00;
  ushort *p;
  Nonnull<const_char_*> pcVar7;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  char *pcVar8;
  ulong uVar9;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar10;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *ctx_00;
  ParseContext *extraout_RDX_01;
  ParseContext *extraout_RDX_02;
  uint uVar11;
  uint *puVar12;
  RepeatedPtrFieldBase *ptr_00;
  int iVar13;
  long v1_00;
  ushort uVar14;
  pair<const_char_*,_unsigned_int> pVar15;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_60;
  TcParser local_48 [16];
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_38;
  
  puVar12 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar12 & 3) != 0) {
    AlignFail(puVar12);
  }
  uVar3 = *(ushort *)((long)puVar12 + 10);
  if ((ulong)(uVar3 & 0x30) == 0x20) {
    pcVar7 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((ulong)(uVar3 & 0x30),0x20,
                        "type_card & field_layout::kFcMask == static_cast<uint16_t>(field_layout::kFcRepeated)"
                       );
  }
  if (pcVar7 == (Nonnull<const_char_*>)0x0) {
    if ((ulong)(uVar3 & 0x1c0) == 0x40) {
      pcVar7 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((ulong)(uVar3 & 0x1c0),0x40,
                          "type_card & field_layout::kRepMask == static_cast<uint16_t>(field_layout::kRepGroup)"
                         );
    }
    if (pcVar7 == (Nonnull<const_char_*>)0x0) {
      if ((data.field_0._0_4_ & 7) != 3) {
        UNRECOVERED_JUMPTABLE = table->fallback;
LAB_0022727c:
        pcVar8 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
        return pcVar8;
      }
      field = (RepeatedPtrFieldBase *)((long)&msg->_vptr_MessageLite + (ulong)*puVar12);
      if (((ulong)field & 7) != 0) {
        AlignFail(field);
      }
      local_60 = *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                  ((long)&table->has_bits_offset +
                  (ulong)(ushort)puVar12[2] * 8 + (ulong)table->aux_offset);
      uVar14 = uVar3 >> 9 & 3;
      aVar10 = data.field_0;
      if (uVar14 != 2) {
        if ((uVar3 >> 9 & 3) == 0) {
          MpRepeatedMessageOrGroup<false,true>(local_48);
          goto LAB_0022739e;
        }
        if (uVar14 != 1) {
          local_60.data = *local_60.data;
        }
        local_60.data = (uint64_t)MessageLite::GetTcParseTable(local_60.data);
        aVar10 = data.field_0;
      }
      do {
        local_38 = aVar10;
        ptr_00 = field;
        msg_00 = AddMessage((TcParseTableBase *)local_60,field);
        aVar10 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)ctx->depth_;
        v1 = aVar10.data - 1;
        iVar6 = (int)v1;
        ctx->depth_ = iVar6;
        if ((long)aVar10.data < 1) {
          p = (ushort *)0x0;
          ctx_00 = extraout_RDX;
        }
        else {
          v1_00 = (long)ctx->group_depth_ + 1;
          iVar13 = (int)v1_00;
          ctx->group_depth_ = iVar13;
          aVar10 = local_60;
          ptr_00 = (RepeatedPtrFieldBase *)ptr;
          p = (ushort *)ParseLoopPreserveNone(msg_00,ptr,ctx,(TcParseTableBase *)local_60);
          ctx_00 = extraout_RDX_00;
          if (p != (ushort *)0x0) {
            if (iVar6 == ctx->depth_) {
              pcVar7 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                 (v1,(long)ctx->depth_,"old_depth == depth_");
              ctx_00 = extraout_RDX_01;
            }
            if (pcVar7 == (Nonnull<const_char_*>)0x0) {
              ptr_00 = (RepeatedPtrFieldBase *)(long)ctx->group_depth_;
              if (iVar13 == ctx->group_depth_) {
                pcVar7 = (Nonnull<const_char_*>)0x0;
              }
              else {
                pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                   (v1_00,(long)ptr_00,"old_group_depth == group_depth_");
                ctx_00 = extraout_RDX_02;
              }
              if (pcVar7 == (Nonnull<const_char_*>)0x0) goto LAB_002271a6;
            }
            else {
              MpRepeatedMessageOrGroup<false,true>();
            }
            MpRepeatedMessageOrGroup<false,true>();
            goto LAB_002273bd;
          }
LAB_002271a6:
          ctx->group_depth_ = ctx->group_depth_ + -1;
          ctx->depth_ = ctx->depth_ + 1;
          uVar4 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
          msg_00 = (MessageLite *)0x0;
          data.field_0 = local_38;
          if (uVar4 != (uint32_t)local_38.data) {
            p = (ushort *)0x0;
          }
        }
        pVar15._8_8_ = ctx_00;
        pVar15.first = (char *)msg_00;
        if (p == (ushort *)0x0) {
          iVar6 = 8;
        }
        else if (p < (ctx->super_EpsCopyInputStream).limit_end_) {
          bVar1 = (byte)*p;
          puVar12 = (uint *)(ulong)bVar1;
          ptr = (char *)((long)p + 1);
          if ((char)bVar1 < '\0') {
            bVar2 = *(byte *)&((RepeatedPtrFieldBase *)ptr)->tagged_rep_or_elem_;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = ctx_00;
            pVar15 = (pair<const_char_*,_unsigned_int>)(auVar5 << 0x40);
            aVar10.data = (ulong)bVar2 << 7;
            uVar11 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
            puVar12 = (uint *)(ulong)uVar11;
            if ((char)bVar2 < '\0') {
              ptr_00 = (RepeatedPtrFieldBase *)(ulong)uVar11;
              pVar15 = ReadTagFallback((char *)p,uVar11);
              ptr = pVar15.first;
              puVar12 = (uint *)(ulong)pVar15.second;
            }
            else {
              ptr = (char *)(p + 1);
            }
          }
          ctx_00 = pVar15._8_8_;
          iVar6 = (uint)((RepeatedPtrFieldBase *)ptr == (RepeatedPtrFieldBase *)0x0) << 3;
        }
        else {
          iVar6 = 9;
        }
        if (iVar6 != 0) {
          if (iVar6 == 8) {
            pcVar8 = Error(msg,(char *)ptr_00,ctx_00,(TcFieldData)aVar10,table,hasbits);
            return pcVar8;
          }
          goto LAB_002272f0;
        }
        aVar10 = local_38;
      } while ((int)puVar12 == SUB84(data.field_0.data,0));
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) {
LAB_002272f0:
        if ((ulong)table->has_bits_offset != 0) {
          puVar12 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
          if (((ulong)puVar12 & 3) != 0) {
LAB_0022739e:
            AlignFail();
          }
          *puVar12 = *puVar12 | (uint)hasbits;
        }
        return (char *)p;
      }
      uVar11 = (uint)table->fast_idx_mask & (uint)*p;
      if ((uVar11 & 7) == 0) {
        uVar9 = (ulong)(uVar11 & 0xfffffff8);
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                       ((ulong)*p ^ *(ulong *)(&table[1].fast_idx_mask + uVar9 * 2));
        UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar9);
        ptr = (char *)p;
        goto LAB_0022727c;
      }
      goto LAB_002273d7;
    }
  }
  else {
LAB_002273bd:
    MpRepeatedMessageOrGroup<false,true>();
  }
  MpRepeatedMessageOrGroup<false,true>();
LAB_002273d7:
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x452);
}

Assistant:

const char* TcParser::MpRepeatedMessageOrGroup(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  ABSL_DCHECK_EQ(type_card & field_layout::kFcMask,
                 static_cast<uint16_t>(field_layout::kFcRepeated));
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  // Validate wiretype:
  if (!is_group) {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepMessage));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  } else {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepGroup));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_START_GROUP) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  RepeatedPtrFieldBase& field =
      MaybeCreateRepeatedRefAt<RepeatedPtrFieldBase, is_split>(
          base, entry.offset, msg);
  const TcParseTableBase* inner_table =
      GetTableFromAux(type_card, *table->field_aux(&entry));

  const char* ptr2 = ptr;
  uint32_t next_tag;
  do {
    MessageLite* value = AddMessage(inner_table, field);
    const auto inner_loop = [&](const char* ptr) {
      return ParseLoopPreserveNone(value, ptr, ctx, inner_table);
    };
    ptr = is_group ? ctx->ParseGroupInlined(ptr2, decoded_tag, inner_loop)
                   : ctx->ParseLengthDelimitedInlined(ptr2, inner_loop);
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}